

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hxx
# Opt level: O2

XMLNodeAdapter * FileParse::operator>>(XMLNodeAdapter *node,Child<BSDFData::Optical> *child)

{
  pointer pbVar1;
  pointer pbVar2;
  optional<XMLNodeAdapter> childNode;
  _Optional_payload_base<XMLNodeAdapter> _Stack_48;
  
  pbVar1 = (child->nodeNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (child->nodeNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    (*(node->super_INodeAdapter<XMLNodeAdapter>)._vptr_INodeAdapter[6])
              (&_Stack_48,node,pbVar2->_M_string_length,(pbVar2->_M_dataplus)._M_p);
    if (_Stack_48._M_engaged == true) {
      BSDFData::operator>>((XMLNodeAdapter *)&_Stack_48,child->data);
    }
    std::_Optional_payload_base<XMLNodeAdapter>::_M_reset(&_Stack_48);
  }
  return node;
}

Assistant:

inline const NodeAdapter & operator>>(const NodeAdapter & node, const Child<T> & child)
    {
        for(const auto & nodeName : child.nodeNames)
        {
            auto childNode{node.getFirstChildByName(nodeName)};
            if(childNode.has_value())
            {
                childNode.value() >> child.data;
            }
        }
        return node;
    }